

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderRenderCase::setupDefaultInputs(ShaderRenderCase *this,int programID)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  Type TVar5;
  undefined4 extraout_var;
  size_type sVar6;
  NotSupportedError *pNVar7;
  Texture2D *this_00;
  TextureCube *this_01;
  Texture2DArray *this_02;
  Texture3D *this_03;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_aa;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_85;
  allocator<char> local_71;
  string local_70;
  deUint32 local_4c;
  ContextType local_48;
  ApiType local_44;
  deUint32 local_40;
  int local_3c;
  deUint32 texObj;
  deUint32 texTarget;
  Sampler *sampler;
  TextureBinding *tex;
  long lStack_20;
  int ndx;
  Functions *gl;
  ShaderRenderCase *pSStack_10;
  int programID_local;
  ShaderRenderCase *this_local;
  
  gl._4_4_ = programID;
  pSStack_10 = this;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar3);
  setupDefaultUniforms(this->m_renderCtx,gl._4_4_);
  dVar4 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar4,"post uniform setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderRenderCase.cpp"
                  ,0x1e3);
  tex._4_4_ = 0;
  do {
    iVar3 = tex._4_4_;
    sVar6 = std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::size
                      (&this->m_textures);
    if ((int)sVar6 <= iVar3) {
      dVar4 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar4,"texture sampler setup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderRenderCase.cpp"
                      ,0x219);
      return;
    }
    sampler = (Sampler *)
              std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
              operator[](&this->m_textures,(long)tex._4_4_);
    _texObj = TextureBinding::getSampler((TextureBinding *)sampler);
    local_3c = 0;
    local_40 = 0;
    TVar5 = TextureBinding::getType((TextureBinding *)sampler);
    if (TVar5 != TYPE_NONE) {
      local_48.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
      local_44 = glu::ContextType::getAPI(&local_48);
      local_4c = (deUint32)glu::ApiType::es(2,0);
      bVar2 = glu::ApiType::operator==(&local_44,(ApiType)local_4c);
      if (bVar2) {
        TVar5 = TextureBinding::getType((TextureBinding *)sampler);
        if (TVar5 == TYPE_2D_ARRAY) {
          local_85 = 1;
          pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"2D array texture binding is not supported",&local_71);
          tcu::NotSupportedError::NotSupportedError(pNVar7,&local_70);
          local_85 = 0;
          __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                      tcu::NotSupportedError::~NotSupportedError);
        }
        TVar5 = TextureBinding::getType((TextureBinding *)sampler);
        if (TVar5 == TYPE_3D) {
          local_aa = 1;
          pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,"3D texture binding is not supported",&local_a9);
          tcu::NotSupportedError::NotSupportedError(pNVar7,&local_a8);
          local_aa = 0;
          __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                      tcu::NotSupportedError::~NotSupportedError);
        }
        if (_texObj->compare != COMPAREMODE_NONE) {
          pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,"Shadow lookups are not supported",&local_d1);
          tcu::NotSupportedError::NotSupportedError(pNVar7,&local_d0);
          __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                      tcu::NotSupportedError::~NotSupportedError);
        }
      }
      TVar5 = TextureBinding::getType((TextureBinding *)sampler);
      switch(TVar5) {
      case TYPE_2D:
        local_3c = 0xde1;
        this_00 = TextureBinding::get2D((TextureBinding *)sampler);
        local_40 = glu::Texture2D::getGLTexture(this_00);
        break;
      case TYPE_CUBE_MAP:
        local_3c = 0x8513;
        this_01 = TextureBinding::getCube((TextureBinding *)sampler);
        local_40 = glu::TextureCube::getGLTexture(this_01);
        break;
      case TYPE_2D_ARRAY:
        local_3c = 0x8c1a;
        this_02 = TextureBinding::get2DArray((TextureBinding *)sampler);
        local_40 = glu::Texture2DArray::getGLTexture(this_02);
        break;
      case TYPE_3D:
        local_3c = 0x806f;
        this_03 = TextureBinding::get3D((TextureBinding *)sampler);
        local_40 = glu::Texture3D::getGLTexture(this_03);
      }
      (**(code **)(lStack_20 + 8))(tex._4_4_ + 0x84c0);
      (**(code **)(lStack_20 + 0xb8))(local_3c,local_40);
      iVar3 = local_3c;
      pcVar1 = *(code **)(lStack_20 + 0x1360);
      dVar4 = glu::getGLWrapMode(_texObj->wrapS);
      (*pcVar1)(iVar3,0x2802,dVar4);
      iVar3 = local_3c;
      pcVar1 = *(code **)(lStack_20 + 0x1360);
      dVar4 = glu::getGLWrapMode(_texObj->wrapT);
      (*pcVar1)(iVar3,0x2803,dVar4);
      iVar3 = local_3c;
      pcVar1 = *(code **)(lStack_20 + 0x1360);
      dVar4 = glu::getGLFilterMode(_texObj->minFilter);
      (*pcVar1)(iVar3,0x2801,dVar4);
      iVar3 = local_3c;
      pcVar1 = *(code **)(lStack_20 + 0x1360);
      dVar4 = glu::getGLFilterMode(_texObj->magFilter);
      (*pcVar1)(iVar3,0x2800,dVar4);
      if (local_3c == 0x806f) {
        pcVar1 = *(code **)(lStack_20 + 0x1360);
        dVar4 = glu::getGLWrapMode(_texObj->wrapR);
        (*pcVar1)(0x806f,0x8072,dVar4);
      }
      if (_texObj->compare != COMPAREMODE_NONE) {
        (**(code **)(lStack_20 + 0x1360))(local_3c,0x884c,0x884e);
        iVar3 = local_3c;
        pcVar1 = *(code **)(lStack_20 + 0x1360);
        dVar4 = glu::getGLCompareFunc(_texObj->compare);
        (*pcVar1)(iVar3,0x884d,dVar4);
      }
    }
    tex._4_4_ = tex._4_4_ + 1;
  } while( true );
}

Assistant:

void ShaderRenderCase::setupDefaultInputs (int programID)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	// SETUP UNIFORMS.

	setupDefaultUniforms(m_renderCtx, programID);

	GLU_EXPECT_NO_ERROR(gl.getError(), "post uniform setup");

	// SETUP TEXTURES.

	for (int ndx = 0; ndx < (int)m_textures.size(); ndx++)
	{
		const TextureBinding&	tex			= m_textures[ndx];
		const tcu::Sampler&		sampler		= tex.getSampler();
		deUint32				texTarget	= GL_NONE;
		deUint32				texObj		= 0;

		if (tex.getType() == TextureBinding::TYPE_NONE)
			continue;

		// Feature check.
		if (m_renderCtx.getType().getAPI() == glu::ApiType::es(2,0))
		{
			if (tex.getType() == TextureBinding::TYPE_2D_ARRAY)
				throw tcu::NotSupportedError("2D array texture binding is not supported");

			if (tex.getType() == TextureBinding::TYPE_3D)
				throw tcu::NotSupportedError("3D texture binding is not supported");

			if (sampler.compare != tcu::Sampler::COMPAREMODE_NONE)
				throw tcu::NotSupportedError("Shadow lookups are not supported");
		}

		switch (tex.getType())
		{
			case TextureBinding::TYPE_2D:		texTarget = GL_TEXTURE_2D;			texObj = tex.get2D()->getGLTexture();		break;
			case TextureBinding::TYPE_CUBE_MAP:	texTarget = GL_TEXTURE_CUBE_MAP;	texObj = tex.getCube()->getGLTexture();		break;
			case TextureBinding::TYPE_2D_ARRAY:	texTarget = GL_TEXTURE_2D_ARRAY;	texObj = tex.get2DArray()->getGLTexture();	break;
			case TextureBinding::TYPE_3D:		texTarget = GL_TEXTURE_3D;			texObj = tex.get3D()->getGLTexture();		break;
			default:
				DE_ASSERT(DE_FALSE);
		}

		gl.activeTexture(GL_TEXTURE0+ndx);
		gl.bindTexture(texTarget, texObj);
		gl.texParameteri(texTarget, GL_TEXTURE_WRAP_S,		glu::getGLWrapMode(sampler.wrapS));
		gl.texParameteri(texTarget, GL_TEXTURE_WRAP_T,		glu::getGLWrapMode(sampler.wrapT));
		gl.texParameteri(texTarget, GL_TEXTURE_MIN_FILTER,	glu::getGLFilterMode(sampler.minFilter));
		gl.texParameteri(texTarget, GL_TEXTURE_MAG_FILTER,	glu::getGLFilterMode(sampler.magFilter));

		if (texTarget == GL_TEXTURE_3D)
			gl.texParameteri(texTarget, GL_TEXTURE_WRAP_R, glu::getGLWrapMode(sampler.wrapR));

		if (sampler.compare != tcu::Sampler::COMPAREMODE_NONE)
		{
			gl.texParameteri(texTarget, GL_TEXTURE_COMPARE_MODE, GL_COMPARE_REF_TO_TEXTURE);
			gl.texParameteri(texTarget, GL_TEXTURE_COMPARE_FUNC, glu::getGLCompareFunc(sampler.compare));
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "texture sampler setup");
}